

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_peaks.cpp
# Opt level: O3

void trt_pose::parse::find_peaks_out_nchw
               (int *counts,int *peaks,float *input,int N,int C,int H,int W,int M,float threshold,
               int window_size)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  
  if (0 < N) {
    uVar3 = (ulong)(uint)N;
    iVar2 = 0;
    iVar1 = 0;
    do {
      find_peaks_out_chw(counts,peaks + iVar2,input + iVar1,C,H,W,M,threshold,window_size);
      iVar1 = iVar1 + W * H * C;
      iVar2 = iVar2 + M * C * 2;
      counts = counts + C;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  return;
}

Assistant:

void find_peaks_out_nchw(int *counts,        // C
                         int *peaks,         // CxMx2
                         const float *input, // CxHxW
                         const int N, const int C, const int H, const int W,
                         const int M, const float threshold,
                         const int window_size) {
  for (int n = 0; n < N; n++) {
    int *counts_n = &counts[n * C];
    int *peaks_n = &peaks[n * C * M * 2];
    const float *input_n = &input[n * C * H * W];
    find_peaks_out_chw(counts_n, peaks_n, input_n, C, H, W, M, threshold,
                       window_size);
  }
}